

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O3

uint32_t aom_rb_read_uvlc(aom_read_bit_buffer *rb)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = 0;
  do {
    iVar1 = aom_rb_read_bit(rb);
    if (iVar1 != 0) {
      if (iVar3 == 0) {
        uVar2 = 0;
      }
      else {
        uVar4 = iVar3 + 1;
        uVar2 = 0;
        do {
          iVar1 = aom_rb_read_bit(rb);
          uVar2 = uVar2 | iVar1 << ((char)uVar4 - 2U & 0x1f);
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      return uVar2 + ~(-1 << ((byte)iVar3 & 0x1f));
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x20);
  return 0xffffffff;
}

Assistant:

uint32_t aom_rb_read_uvlc(struct aom_read_bit_buffer *rb) {
  int leading_zeros = 0;
  while (leading_zeros < 32 && !aom_rb_read_bit(rb)) ++leading_zeros;
  // Maximum 32 bits.
  if (leading_zeros == 32) return UINT32_MAX;
  const uint32_t base = (1u << leading_zeros) - 1;
  const uint32_t value = aom_rb_read_literal(rb, leading_zeros);
  return base + value;
}